

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

DescriptorFlags __thiscall
Js::PathTypeHandlerWithAttr::GetSetter
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,PropertyId propertyId,
          Var *setterValue,PropertyValueInfo *info,ScriptContext *requestContext)

{
  ObjectSlotAttributes OVar1;
  byte bVar2;
  code *pcVar3;
  bool bVar4;
  PropertyIndex PVar5;
  DescriptorFlags DVar6;
  undefined4 *puVar7;
  uchar *puVar8;
  Var pvVar9;
  
  PVar5 = TypePath::LookupInline
                    ((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.typePath.ptr,
                     propertyId,
                     (uint)((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                            super_DynamicTypeHandler.unusedBytes >> 1));
  if (PVar5 == 0xffff) {
    DVar6 = DynamicTypeHandler::GetSetter
                      ((DynamicTypeHandler *)this,instance,propertyId,setterValue,info,
                       requestContext);
    return DVar6;
  }
  OVar1 = (this->attributes).ptr[PVar5];
  DVar6 = None;
  if ((OVar1 & ObjectSlotAttr_Deleted) == ObjectSlotAttr_None) {
    if ((OVar1 & ObjectSlotAttr_Accessor) == ObjectSlotAttr_None) {
      return OVar1 & Writable | Data;
    }
    puVar8 = (this->setters).ptr;
    if (puVar8 == (uchar *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xe98,"(setters != nullptr)","setters != nullptr");
      if (!bVar4) goto LAB_00c4eb10;
      *puVar7 = 0;
      puVar8 = (this->setters).ptr;
    }
    bVar2 = puVar8[PVar5];
    if ((bVar2 == 0xff) ||
       ((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
        unusedBytes >> 1 <= (ushort)bVar2)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xe9a,
                                  "(setterSlot != NoSetterSlot && setterSlot < GetPathLength())",
                                  "setterSlot != NoSetterSlot && setterSlot < GetPathLength()");
      if (!bVar4) goto LAB_00c4eb10;
      *puVar7 = 0;
    }
    bVar4 = VarIsImpl<Js::DynamicObject>(&instance->super_RecyclableObject);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xe9b,"(VarIsCorrectType(instance))","VarIsCorrectType(instance)"
                                 );
      if (!bVar4) {
LAB_00c4eb10:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    pvVar9 = DynamicObject::GetSlot(instance,(uint)bVar2);
    *setterValue = pvVar9;
    DVar6 = Accessor;
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = (ushort)bVar2;
      info->m_attributes = OVar1 & ObjectSlotAttr_PropertyAttributesMask;
      info->flags = InlineCacheSetterFlag;
    }
  }
  return DVar6;
}

Assistant:

DescriptorFlags PathTypeHandlerWithAttr::GetSetter(DynamicObject* instance, PropertyId propertyId, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        PropertyIndex propertyIndex = GetTypePath()->LookupInline(propertyId, GetPathLength());
        if (propertyIndex == Constants::NoSlot)
        {
            return __super::GetSetter(instance, propertyId, setterValue, info, requestContext);
        }
        ObjectSlotAttributes attr = attributes[propertyIndex];
        if (attr & ObjectSlotAttr_Deleted)
        {
            return None;
        }

        if (attr & ObjectSlotAttr_Accessor)
        {
            Assert(setters != nullptr);
            PathTypeSetterSlotIndex setterSlot = setters[propertyIndex];
            Assert(setterSlot != NoSetterSlot && setterSlot < GetPathLength());
            AssertOrFailFast(VarIsCorrectType(instance));
            *setterValue = instance->GetSlot(setterSlot);
            PropertyValueInfo::Set(info, instance, setterSlot, ObjectSlotAttributesToPropertyAttributes(attr), InlineCacheSetterFlag);
            return Accessor;
        }

        if (attr & ObjectSlotAttr_Writable)
        {
            return WritableData;
        }
        return Data;
    }